

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void hash_table_increase_buckets(hash_table_t *table)

{
  hash_table_bucket_t *phVar1;
  hash_table_bucket_t *phVar2;
  uint buckets;
  size_t sVar3;
  ulong uVar4;
  hash_table_bucket_t *c;
  hash_table_bucket_t *b;
  size_t local_50;
  size_t local_48;
  hash_table_bucket_t *local_40;
  universal_hash_function_t new_ghash;
  hash_table_bucket_t *new_table;
  uint new_n_buckets;
  uint j;
  uint i;
  hash_table_t *table_local;
  
  if (table->n_buckets == 0) {
    __assert_fail("table->n_buckets > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/util.c"
                  ,0xfe,"void hash_table_increase_buckets(hash_table_t *)");
  }
  new_ghash._16_8_ = calloc((ulong)(table->n_buckets * 2 + 1),0x10);
  if ((hash_table_bucket_t *)new_ghash._16_8_ == (hash_table_bucket_t *)0x0) {
    fprintf(_stderr,"hash_table_increase_buckets: insufficient memory\n");
    abort();
  }
  ((hash_table_bucket_t *)new_ghash._16_8_)->next = table->allocs;
  table->allocs = (hash_table_bucket_t *)new_ghash._16_8_;
  new_ghash._16_8_ = new_ghash._16_8_ + 0x10;
  buckets = table->n_buckets << 1;
  new_universal_hash_function((universal_hash_function_t *)&b,&table->seed,buckets);
  local_40 = b;
  new_ghash.mult = local_50;
  new_ghash.add = local_48;
  for (new_n_buckets = 0; new_n_buckets < table->n_buckets; new_n_buckets = new_n_buckets + 1) {
    c = table->buckets[new_n_buckets].next;
    while (phVar2 = local_40, c != (hash_table_bucket_t *)0x0) {
      phVar1 = c->next;
      sVar3 = (*table->hash)(c->data);
      uVar4 = (long)phVar2 * sVar3 + new_ghash.mult >> (0x40U - (char)new_ghash.add & 0x3f);
      c->next = *(hash_table_bucket_t **)(new_ghash._16_8_ + (uVar4 & 0xffffffff) * 0x10 + 8);
      *(hash_table_bucket_t **)(new_ghash._16_8_ + (uVar4 & 0xffffffff) * 0x10 + 8) = c;
      c = phVar1;
    }
  }
  for (new_n_buckets = 0; new_n_buckets < table->n_buckets - 1; new_n_buckets = new_n_buckets + 1) {
    table->buckets[new_n_buckets].next = table->buckets + (new_n_buckets + 1);
    table->buckets[new_n_buckets].data = (void *)0x0;
  }
  table->buckets[table->n_buckets - 1].next = table->free_buckets;
  table->buckets[table->n_buckets - 1].data = (void *)0x0;
  table->free_buckets = table->buckets;
  table->buckets = (hash_table_bucket_t *)new_ghash._16_8_;
  table->n_buckets = buckets;
  (table->ghash).mult = (size_t)local_40;
  (table->ghash).add = new_ghash.mult;
  *(size_t *)&(table->ghash).log2_buckets = new_ghash.add;
  return;
}

Assistant:

static void hash_table_increase_buckets( hash_table_t * table )
{
    unsigned i, j, new_n_buckets ;
    hash_table_bucket_t * new_table ;
    universal_hash_function_t new_ghash;
    assert( table->n_buckets > 0 );
    
    new_table = calloc(table->n_buckets * 2 + 1, sizeof(hash_table_bucket_t));
    if (!new_table) {
        fprintf(stderr, "hash_table_increase_buckets: "
                "insufficient memory\n");
        abort();
    }
    new_table->next = table->allocs;
    table->allocs = new_table;
    new_table += 1;

    new_n_buckets = 2 * table->n_buckets;
    new_ghash = new_universal_hash_function(&table->seed, new_n_buckets);
    
    /* rehash existing items*/
    for ( i = 0; i < table->n_buckets ; ++i ) {
        hash_table_bucket_t * b = table->buckets[i].next;
        while (b) {
            hash_table_bucket_t * c = b->next;
            j = (unsigned) hash( new_ghash, (* table->hash )( b->data ) );
            
            b->next = new_table[j].next;
            new_table[j].next = b;

            b = c;
        }
    }

    /* return old buckets to free list */
    for ( i = 0; i < table->n_buckets - 1; ++i ) {
        table->buckets[i].next = &table->buckets[i+1];
        table->buckets[i].data = NULL;
    } 
    table->buckets[table->n_buckets-1].next = table->free_buckets;
    table->buckets[table->n_buckets-1].data = NULL;
    table->free_buckets = table->buckets;

    /* commit changes */
    table->buckets = new_table;
    table->n_buckets = new_n_buckets;
    table->ghash = new_ghash;
}